

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,true,false,true>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  HomomorphismModel *in_RDI;
  int got_reverse_label;
  uint c_1;
  int want_reverse_label;
  SVOBitset check_d_values_1;
  PatternAdjacencyBitsType *reverse_edge_graph_pairs_to_consider_1;
  int got_forward_label;
  uint c;
  int want_forward_label;
  SVOBitset check_d_values;
  uint g;
  PatternAdjacencyBitsType *reverse_edge_graph_pairs_to_consider;
  conditional_t<true,_SVOBitset,_tuple<>_> before;
  PatternAdjacencyBitsType *graph_pairs_to_consider;
  int in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  uint in_stack_fffffffffffffc94;
  uint in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  SVOBitset *in_stack_fffffffffffffca0;
  SVOBitset *in_stack_fffffffffffffce0;
  uint local_300;
  byte local_269;
  byte *local_268;
  int local_25c;
  uint local_258;
  int local_254;
  uint local_14c;
  byte local_c9;
  byte *local_c8;
  SVOBitset local_b0;
  byte local_21;
  byte *local_20;
  
  local_21 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
  local_20 = &local_21;
  SVOBitset::SVOBitset(&local_b0);
  SVOBitset::operator=
            ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             (SVOBitset *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  if ((*local_20 & 1) != 0) {
    in_stack_fffffffffffffce0 =
         HomomorphismModel::forward_target_graph_row
                   ((HomomorphismModel *)
                    CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                    in_stack_fffffffffffffc7c);
    SVOBitset::operator&=
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  }
  local_c9 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
  local_c8 = &local_c9;
  if ((local_c9 & 1) != 0) {
    HomomorphismModel::reverse_target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c);
    SVOBitset::operator&=
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  }
  uVar1 = SVOBitset::count(in_stack_fffffffffffffca0);
  uVar2 = SVOBitset::count(in_stack_fffffffffffffca0);
  if (uVar1 != uVar2) {
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x174eaa);
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              (in_RDI,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    HomomorphismModel::target_vertex_for_proof_abi_cxx11_
              (in_RDI,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    SVOBitset::count(in_stack_fffffffffffffca0);
    SVOBitset::count(in_stack_fffffffffffffca0);
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              (in_RDI,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
    Proof::propagated((Proof *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                      (NamedVertex *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                      (NamedVertex *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                      in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,(NamedVertex *)0x174f6d);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x174f7c);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x174f89);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x174f96);
  }
  SVOBitset::operator=
            ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             (SVOBitset *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  for (local_14c = 1;
      local_14c <
      *(uint *)&(((in_RDI->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>;
      local_14c = local_14c + 1) {
    if (((uint)*local_20 & 1 << ((byte)local_14c & 0x1f)) != 0) {
      HomomorphismModel::target_graph_row
                ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
      SVOBitset::operator&=
                ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (SVOBitset *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    uVar1 = SVOBitset::count(in_stack_fffffffffffffca0);
    uVar2 = SVOBitset::count(in_stack_fffffffffffffca0);
    if (uVar1 != uVar2) {
      in_stack_fffffffffffffca0 =
           (SVOBitset *)
           std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1750de);
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                (in_RDI,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
      HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                (in_RDI,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
      in_stack_fffffffffffffc94 = local_14c;
      in_stack_fffffffffffffc98 = SVOBitset::count(in_stack_fffffffffffffca0);
      uVar1 = SVOBitset::count(in_stack_fffffffffffffca0);
      in_stack_fffffffffffffc9c = in_stack_fffffffffffffc98 - uVar1;
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                (in_RDI,(int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
      Proof::propagated((Proof *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                        (NamedVertex *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                        ,(NamedVertex *)
                         CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                        in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,(NamedVertex *)0x1751ae)
      ;
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1751bd);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1751ca);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1751d7);
    }
    SVOBitset::operator=
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  }
  if ((*local_20 & 1) != 0) {
    SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    local_254 = HomomorphismModel::pattern_edge_label
                          ((HomomorphismModel *)
                           CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                           in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
    local_258 = SVOBitset::find_first
                          ((SVOBitset *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    while (local_258 != 0xffffffff) {
      SVOBitset::reset(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      local_25c = HomomorphismModel::target_edge_label
                            ((HomomorphismModel *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
      if (local_25c != local_254) {
        SVOBitset::reset(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      }
      local_258 = SVOBitset::find_first
                            ((SVOBitset *)
                             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    }
    SVOBitset::~SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  }
  local_269 = HomomorphismModel::pattern_adjacency_bits
                        ((HomomorphismModel *)
                         CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                         in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
  local_268 = &local_269;
  if ((local_269 & 1) != 0) {
    SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    iVar3 = HomomorphismModel::pattern_edge_label
                      ((HomomorphismModel *)
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc84 = iVar3;
    local_300 = SVOBitset::find_first
                          ((SVOBitset *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    while (local_300 != 0xffffffff) {
      SVOBitset::reset(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      in_stack_fffffffffffffc80 =
           HomomorphismModel::target_edge_label
                     ((HomomorphismModel *)
                      CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                      in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
      if (in_stack_fffffffffffffc80 != iVar3) {
        SVOBitset::reset(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      }
      local_300 = SVOBitset::find_first
                            ((SVOBitset *)
                             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    }
    SVOBitset::~SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  }
  SVOBitset::~SVOBitset((SVOBitset *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}